

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  aiFace *paVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  aiMatrix4x4 *paVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vertex *pVVar19;
  pointer pbVar20;
  aiMesh **ppaVar21;
  aiMesh *paVar22;
  ulong uVar23;
  ulong *puVar24;
  aiFace *paVar25;
  aiVector3D *__s;
  aiVector3D *__s_00;
  uint *puVar26;
  Logger *pLVar27;
  pointer ppVar28;
  aiBone **ppaVar29;
  aiBone *paVar30;
  aiVertexWeight *__s_01;
  ulong uVar31;
  pointer pBVar32;
  pointer pbVar33;
  long lVar34;
  pointer pBVar35;
  uint uVar36;
  pointer ppVar37;
  pointer pFVar38;
  ulong *puVar39;
  uint uVar40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  aiScene *paVar41;
  uint iVert;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar42;
  long lVar43;
  ulong uVar44;
  uint i;
  ulong uVar45;
  bool bVar46;
  uint local_cc;
  undefined8 local_c8;
  ulong local_c0;
  ulong *local_b8;
  uint local_ac;
  ulong local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  aiVector3D *local_98;
  aiMesh **local_90;
  undefined1 local_88 [8];
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ulong *local_68;
  ulong *local_60;
  aiVector3D *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  aiVector3D *local_40;
  Vertex *local_38;
  
  pbVar33 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar20 = (this->aszTextures).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar33 == pbVar20) {
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_88 = (undefined1  [8])&local_78;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->aszTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if (local_88 != (undefined1  [8])&local_78) {
      operator_delete((void *)local_88,
                      CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
    }
    pbVar33 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar20 = (this->aszTextures).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  this->pScene->mNumMeshes = (uint)((ulong)((long)pbVar20 - (long)pbVar33) >> 5);
  paVar41 = this->pScene;
  ppaVar21 = (aiMesh **)operator_new__((ulong)paVar41->mNumMeshes << 3);
  paVar41->mMeshes = ppaVar21;
  paVar41 = this->pScene;
  uVar36 = paVar41->mNumMeshes;
  uVar31 = (ulong)uVar36;
  local_68 = (ulong *)operator_new__(uVar31 * 0x18 + 8);
  *local_68 = uVar31;
  pvVar42 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 1);
  if (uVar36 != 0) {
    memset(pvVar42,0,((uVar31 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  uVar45 = 0;
  uVar31 = (ulong)(uint)((int)((ulong)((long)(this->asTriangles).
                                             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->asTriangles).
                                            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x3d70a3d7) / (ulong)paVar41->mNumMeshes;
  local_cc = (int)(uVar31 >> 1) + (int)uVar31;
  local_a0 = pvVar42;
  do {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(pvVar42,(ulong)local_cc);
    uVar45 = uVar45 + 1;
    paVar41 = this->pScene;
    pvVar42 = pvVar42 + 1;
  } while (uVar45 < paVar41->mNumMeshes);
  pFVar38 = (this->asTriangles).
            super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_cc = 0;
  if (pFVar38 !=
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pvVar42 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_68 + 0x2fffffffe);
    do {
      uVar31 = (ulong)pFVar38->iTexture;
      if (uVar31 == 0xffffffff) {
        local_88 = (undefined1  [8])((ulong)local_88 & 0xffffffff00000000);
        this_01 = pvVar42;
LAB_0060aeea:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)local_88);
      }
      else {
        if ((ulong)((long)(this->aszTextures).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->aszTextures).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar31) {
          pLVar27 = DefaultLogger::get();
          Logger::info(pLVar27,"[SMD/VTA] Material index overflow in face");
          local_88._0_4_ =
               (int)((ulong)((long)(this->aszTextures).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->aszTextures).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
          this_01 = local_a0 + pFVar38->iTexture;
          goto LAB_0060aeea;
        }
        this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(local_a0 + uVar31);
        __position._M_current = *(uint **)(this_00 + 8);
        if (__position._M_current == *(uint **)(this_00 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_cc);
        }
        else {
          *__position._M_current = local_cc;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
        }
      }
      pFVar38 = pFVar38 + 1;
      local_cc = local_cc + 1;
    } while (pFVar38 !=
             (this->asTriangles).
             super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
             super__Vector_impl_data._M_finish);
    paVar41 = this->pScene;
  }
  if (paVar41->mNumMeshes != 0) {
    uVar36 = 0;
    do {
      local_ac = uVar36;
      paVar22 = (aiMesh *)operator_new(0x520);
      paVar22->mPrimitiveTypes = 0;
      paVar22->mNumVertices = 0;
      paVar22->mNumFaces = 0;
      memset(&paVar22->mVertices,0,0xcc);
      paVar22->mBones = (aiBone **)0x0;
      paVar22->mMaterialIndex = 0;
      (paVar22->mName).length = 0;
      (paVar22->mName).data[0] = '\0';
      memset((paVar22->mName).data + 1,0x1b,0x3ff);
      paVar22->mNumAnimMeshes = 0;
      paVar22->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar22->mMethod = 0;
      (paVar22->mAABB).mMin.x = 0.0;
      (paVar22->mAABB).mMin.y = 0.0;
      (paVar22->mAABB).mMin.z = 0.0;
      (paVar22->mAABB).mMax.x = 0.0;
      (paVar22->mAABB).mMax.y = 0.0;
      (paVar22->mAABB).mMax.z = 0.0;
      memset(paVar22->mColors,0,0xa0);
      ppaVar21 = paVar41->mMeshes;
      uVar31 = (ulong)local_ac;
      ppaVar21[uVar31] = paVar22;
      puVar3 = local_a0[uVar31].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = local_a0[uVar31].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar3 == puVar4) {
        __assert_fail("!aaiFaces[i].empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                      ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
      }
      local_50 = local_a0 + uVar31;
      paVar22->mPrimitiveTypes = 4;
      ppaVar21[uVar31]->mNumVertices = (int)((ulong)((long)puVar4 - (long)puVar3) >> 2) * 3;
      ppaVar21[uVar31]->mNumFaces =
           (uint)((ulong)((long)(local_50->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_50->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      ppaVar21[uVar31]->mMaterialIndex = local_ac;
      pBVar32 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar35 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish;
      lVar43 = (long)pBVar35 - (long)pBVar32 >> 4;
      uVar44 = lVar43 * -0x71c71c71c71c71c7;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar44;
      uVar45 = SUB168(auVar6 * ZEXT816(0x18),0);
      uVar23 = uVar45 + 8;
      if (0xfffffffffffffff7 < uVar45) {
        uVar23 = 0xffffffffffffffff;
      }
      if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
        uVar23 = 0xffffffffffffffff;
      }
      local_60 = (ulong *)operator_new__(uVar23);
      puVar24 = local_60 + 1;
      *local_60 = uVar44;
      local_c0 = uVar31;
      local_90 = ppaVar21;
      if (pBVar35 != pBVar32) {
        lVar34 = 0;
        do {
          *(undefined8 *)((long)puVar24 + lVar34) = 0;
          ((undefined8 *)((long)puVar24 + lVar34))[1] = 0;
          *(undefined8 *)((long)local_60 + lVar34 + 0x18) = 0;
          lVar34 = lVar34 + 0x18;
        } while (lVar43 * 0x5555555555555558 != lVar34);
        if (pBVar35 != pBVar32) {
          uVar45 = 0;
          uVar23 = 1;
          do {
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       *)(puVar24 + uVar45 * 3),ppaVar21[uVar31]->mNumVertices / uVar44);
            uVar44 = ((long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
            bVar46 = uVar23 <= uVar44;
            lVar43 = uVar44 - uVar23;
            uVar45 = uVar23;
            uVar23 = (ulong)((int)uVar23 + 1);
          } while (bVar46 && lVar43 != 0);
        }
      }
      uVar31 = (ulong)ppaVar21[uVar31]->mNumFaces;
      local_b8 = puVar24;
      puVar24 = (ulong *)operator_new__(uVar31 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar24 + 1);
      *puVar24 = uVar31;
      if (uVar31 != 0) {
        paVar25 = paVar1;
        do {
          paVar25->mNumIndices = 0;
          paVar25->mIndices = (uint *)0x0;
          paVar25 = paVar25 + 1;
        } while (paVar25 != paVar1 + uVar31);
      }
      ppaVar21[local_c0]->mFaces = paVar1;
      uVar36 = ppaVar21[local_c0]->mNumVertices;
      uVar31 = (ulong)uVar36 * 0xc;
      __s = (aiVector3D *)operator_new__(uVar31);
      puVar24 = local_b8;
      if ((ulong)uVar36 != 0) {
        memset(__s,0,((uVar31 - 0xc) / 0xc) * 0xc + 0xc);
      }
      uVar31 = local_c0;
      ppaVar21[local_c0]->mNormals = __s;
      uVar36 = ppaVar21[local_c0]->mNumVertices;
      local_c8 = (ulong)uVar36 * 0xc;
      local_98 = (aiVector3D *)operator_new__(local_c8);
      if ((ulong)uVar36 != 0) {
        memset(local_98,0,((local_c8 - 0xc) / 0xc) * 0xc + 0xc);
      }
      ppaVar21[uVar31]->mVertices = local_98;
      if (this->bHasUVs == true) {
        uVar36 = ppaVar21[uVar31]->mNumVertices;
        local_c8 = (ulong)uVar36 * 0xc;
        __s_00 = (aiVector3D *)operator_new__(local_c8);
        if ((ulong)uVar36 != 0) {
          memset(__s_00,0,((local_c8 - 0xc) / 0xc) * 0xc + 0xc);
        }
        ppaVar21[uVar31]->mTextureCoords[0] = __s_00;
        ppaVar21[uVar31]->mNumUVComponents[0] = 2;
      }
      else {
        __s_00 = (aiVector3D *)0x0;
      }
      local_cc = 0;
      paVar22 = ppaVar21[uVar31];
      if (paVar22->mNumFaces != 0) {
        uVar45 = 0;
        do {
          puVar26 = (uint *)operator_new__(0xc);
          local_a8 = uVar45 * 0x10;
          ppaVar21[uVar31]->mFaces[uVar45].mIndices = puVar26;
          ppaVar21[uVar31]->mFaces[uVar45].mNumIndices = 3;
          uVar36 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar45];
          pFVar38 = (this->asTriangles).
                    super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_98->z = pFVar38[uVar36].avVertices[0].pos.z;
          fVar10 = pFVar38[uVar36].avVertices[0].pos.y;
          local_98->x = pFVar38[uVar36].avVertices[0].pos.x;
          local_98->y = fVar10;
          local_98[1].z = pFVar38[uVar36].avVertices[1].pos.z;
          fVar10 = pFVar38[uVar36].avVertices[1].pos.y;
          local_98[1].x = pFVar38[uVar36].avVertices[1].pos.x;
          local_98[1].y = fVar10;
          local_98[2].z = pFVar38[uVar36].avVertices[2].pos.z;
          fVar10 = pFVar38[uVar36].avVertices[2].pos.y;
          local_98[2].x = pFVar38[uVar36].avVertices[2].pos.x;
          local_98[2].y = fVar10;
          __s->z = pFVar38[uVar36].avVertices[0].nor.z;
          fVar10 = pFVar38[uVar36].avVertices[0].nor.y;
          __s->x = pFVar38[uVar36].avVertices[0].nor.x;
          __s->y = fVar10;
          fVar10 = pFVar38[uVar36].avVertices[1].nor.y;
          __s[1].x = pFVar38[uVar36].avVertices[1].nor.x;
          __s[1].y = fVar10;
          __s[1].z = pFVar38[uVar36].avVertices[1].nor.z;
          fVar10 = pFVar38[uVar36].avVertices[2].nor.y;
          __s[2].x = pFVar38[uVar36].avVertices[2].nor.x;
          __s[2].y = fVar10;
          __s[2].z = pFVar38[uVar36].avVertices[2].nor.z;
          if (__s_00 == (aiVector3D *)0x0) {
            local_58 = (aiVector3D *)0x0;
          }
          else {
            __s_00->z = pFVar38[uVar36].avVertices[0].uv.z;
            fVar10 = pFVar38[uVar36].avVertices[0].uv.y;
            __s_00->x = pFVar38[uVar36].avVertices[0].uv.x;
            __s_00->y = fVar10;
            fVar10 = pFVar38[uVar36].avVertices[1].uv.y;
            __s_00[1].x = pFVar38[uVar36].avVertices[1].uv.x;
            __s_00[1].y = fVar10;
            __s_00[1].z = pFVar38[uVar36].avVertices[1].uv.z;
            fVar10 = pFVar38[uVar36].avVertices[2].uv.y;
            __s_00[2].x = pFVar38[uVar36].avVertices[2].uv.x;
            __s_00[2].y = fVar10;
            __s_00[2].z = pFVar38[uVar36].avVertices[2].uv.z;
            local_58 = __s_00 + 3;
          }
          local_38 = pFVar38[uVar36].avVertices;
          local_98 = local_98 + 3;
          local_40 = __s + 3;
          lVar43 = 0;
          local_48 = uVar45;
          do {
            pVVar19 = local_38;
            ppVar28 = *(pointer *)
                       &local_38[lVar43].aiBoneLinks.
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl;
            if (*(pointer *)
                 ((long)&local_38[lVar43].aiBoneLinks.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl + 8) == ppVar28) {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
LAB_0060b54d:
              puVar24 = local_b8;
              uVar45 = (ulong)pVVar19[lVar43].iParentNode;
              if (uVar45 != 0xffffffff) {
                uVar23 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if (uVar23 < uVar45 || uVar23 - uVar45 == 0) {
                  pLVar27 = DefaultLogger::get();
                  Logger::error(pLVar27,
                                "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                               );
                  if (((float)local_c8 != 0.0) || (NAN((float)local_c8))) {
                    ppVar28 = pVVar19[lVar43].aiBoneLinks.
                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ppVar37 = *(pointer *)
                               ((long)&pVVar19[lVar43].aiBoneLinks.
                                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                       ._M_impl + 8);
                    if (ppVar37 != ppVar28) {
                      uVar36 = 1;
                      uVar45 = 0;
                      do {
                        uVar45 = (ulong)ppVar28[uVar45].first;
                        uVar23 = ((long)(this->asBones).
                                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->asBones).
                                        super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x71c71c71c71c71c7;
                        if (uVar45 <= uVar23 && uVar23 - uVar45 != 0) {
                          *(float *)(puVar24[uVar45 * 3 + 1] - 4) =
                               *(float *)(puVar24[uVar45 * 3 + 1] - 4) * (1.0 / (float)local_c8);
                          ppVar28 = pVVar19[lVar43].aiBoneLinks.
                                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          ppVar37 = *(pointer *)
                                     ((long)&pVVar19[lVar43].aiBoneLinks.
                                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                             ._M_impl + 8);
                        }
                        uVar45 = (ulong)uVar36;
                        uVar36 = uVar36 + 1;
                      } while (uVar45 < (ulong)((long)ppVar37 - (long)ppVar28 >> 3));
                    }
                  }
                }
                else {
                  local_88._4_4_ = 1.0 - (float)local_c8;
                  local_88._0_4_ = local_cc;
                  std::
                  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  ::emplace_back<std::pair<unsigned_int,float>>
                            ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                              *)(local_b8 + uVar45 * 3),(pair<unsigned_int,_float> *)local_88);
                }
              }
            }
            else {
              local_c8 = (ulong)local_c8._4_4_ << 0x20;
              uVar31 = 0;
              uVar45 = 1;
              do {
                uVar23 = (ulong)ppVar28[uVar31].first;
                uVar44 = ((long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->asBones).
                                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7;
                if ((uVar44 < uVar23 || uVar44 - uVar23 == 0) ||
                   (ppVar28[uVar31].first == pVVar19[lVar43].iParentNode)) {
                  pLVar27 = DefaultLogger::get();
                  Logger::error(pLVar27,
                                "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                               );
                }
                else {
                  local_88._4_4_ = ppVar28[uVar31].second;
                  local_88._0_4_ = local_cc;
                  std::
                  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                  ::emplace_back<std::pair<unsigned_int,float>>
                            ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                              *)(local_b8 + uVar23 * 3),(pair<unsigned_int,_float> *)local_88);
                  local_c8 = CONCAT44(local_c8._4_4_,(float)local_c8 + ppVar28[uVar31].second);
                }
                ppVar28 = pVVar19[lVar43].aiBoneLinks.
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar46 = uVar45 < (ulong)((long)*(pointer *)
                                                 ((long)&pVVar19[lVar43].aiBoneLinks.
                                                                                                                  
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  ._M_impl + 8) - (long)ppVar28 >> 3);
                uVar31 = uVar45;
                uVar45 = (ulong)((int)uVar45 + 1);
              } while (bVar46);
              ppaVar21 = local_90;
              puVar24 = local_b8;
              uVar31 = local_c0;
              if ((float)local_c8 < 0.975) goto LAB_0060b54d;
            }
            uVar36 = local_cc + 1;
            *(uint *)(*(long *)((long)&ppaVar21[uVar31]->mFaces->mIndices + local_a8) + lVar43 * 4)
                 = local_cc;
            lVar43 = lVar43 + 1;
            local_cc = uVar36;
          } while (lVar43 != 3);
          uVar45 = local_48 + 1;
          paVar22 = ppaVar21[uVar31];
          __s = local_40;
          __s_00 = local_58;
        } while (uVar45 < paVar22->mNumFaces);
      }
      local_cc = 0;
      lVar43 = (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar43 != 0) {
        uVar45 = (lVar43 >> 4) * -0x71c71c71c71c71c7;
        puVar39 = local_60 + 2;
        uVar36 = 0;
        uVar40 = 1;
        do {
          if (puVar39[-1] != *puVar39) {
            uVar36 = uVar36 + 1;
            local_cc = uVar36;
          }
          uVar23 = (ulong)uVar40;
          puVar39 = puVar39 + 3;
          uVar40 = uVar40 + 1;
        } while (uVar23 <= uVar45 && uVar45 - uVar23 != 0);
        if (uVar36 != 0) {
          paVar22->mNumBones = uVar36;
          ppaVar29 = (aiBone **)operator_new__((ulong)ppaVar21[uVar31]->mNumBones << 3);
          ppaVar21[uVar31]->mBones = ppaVar29;
          local_cc = 0;
          pBVar32 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pBVar35 = (this->asBones).
                    super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (pBVar35 != pBVar32) {
            uVar36 = 0;
            uVar45 = 0;
            do {
              if (puVar24[uVar45 * 3] != puVar24[uVar45 * 3 + 1]) {
                puVar24 = puVar24 + uVar45 * 3;
                local_c8 = uVar45;
                local_a8 = uVar45;
                paVar30 = (aiBone *)operator_new(0x460);
                (paVar30->mName).length = 0;
                (paVar30->mName).data[0] = '\0';
                memset((paVar30->mName).data + 1,0x1b,0x3ff);
                paVar30->mNumWeights = 0;
                paVar30->mWeights = (aiVertexWeight *)0x0;
                (paVar30->mOffsetMatrix).a1 = 1.0;
                (paVar30->mOffsetMatrix).a2 = 0.0;
                (paVar30->mOffsetMatrix).a3 = 0.0;
                (paVar30->mOffsetMatrix).a4 = 0.0;
                (paVar30->mOffsetMatrix).b1 = 0.0;
                (paVar30->mOffsetMatrix).b2 = 1.0;
                (paVar30->mOffsetMatrix).b3 = 0.0;
                (paVar30->mOffsetMatrix).b4 = 0.0;
                (paVar30->mOffsetMatrix).c1 = 0.0;
                (paVar30->mOffsetMatrix).c2 = 0.0;
                (paVar30->mOffsetMatrix).c3 = 1.0;
                (paVar30->mOffsetMatrix).c4 = 0.0;
                (paVar30->mOffsetMatrix).d1 = 0.0;
                (paVar30->mOffsetMatrix).d2 = 0.0;
                (paVar30->mOffsetMatrix).d3 = 0.0;
                (paVar30->mOffsetMatrix).d4 = 1.0;
                ppaVar29 = ppaVar21[uVar31]->mBones;
                ppaVar29[uVar36] = paVar30;
                paVar30->mNumWeights = (uint)(puVar24[1] - *puVar24 >> 3);
                uVar40 = ppaVar29[uVar36]->mNumWeights;
                uVar31 = (ulong)uVar40 * 8;
                __s_01 = (aiVertexWeight *)operator_new__(uVar31);
                if ((ulong)uVar40 != 0) {
                  memset(__s_01,0,uVar31);
                }
                ppaVar29[uVar36]->mWeights = __s_01;
                pBVar32 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                paVar30 = ppaVar29[uVar36];
                paVar2 = &pBVar32[local_c8].mOffsetMatrix;
                fVar15 = paVar2->a1;
                fVar16 = paVar2->a2;
                fVar17 = paVar2->a3;
                fVar18 = paVar2->a4;
                pBVar35 = pBVar32 + local_c8;
                fVar13 = (pBVar35->mOffsetMatrix).b1;
                fVar14 = (pBVar35->mOffsetMatrix).b2;
                uVar7 = *(undefined8 *)(&(pBVar35->mOffsetMatrix).b1 + 2);
                pBVar35 = pBVar32 + local_c8;
                fVar11 = (pBVar35->mOffsetMatrix).c1;
                fVar12 = (pBVar35->mOffsetMatrix).c2;
                uVar8 = *(undefined8 *)(&(pBVar35->mOffsetMatrix).c1 + 2);
                pBVar32 = pBVar32 + local_c8;
                fVar10 = (pBVar32->mOffsetMatrix).d2;
                uVar9 = *(undefined8 *)(&(pBVar32->mOffsetMatrix).d1 + 2);
                (paVar30->mOffsetMatrix).d1 = (pBVar32->mOffsetMatrix).d1;
                (paVar30->mOffsetMatrix).d2 = fVar10;
                *(undefined8 *)&(paVar30->mOffsetMatrix).d3 = uVar9;
                (paVar30->mOffsetMatrix).c1 = fVar11;
                (paVar30->mOffsetMatrix).c2 = fVar12;
                *(undefined8 *)&(paVar30->mOffsetMatrix).c3 = uVar8;
                (paVar30->mOffsetMatrix).b1 = fVar13;
                (paVar30->mOffsetMatrix).b2 = fVar14;
                *(undefined8 *)&(paVar30->mOffsetMatrix).b3 = uVar7;
                (paVar30->mOffsetMatrix).a1 = fVar15;
                (paVar30->mOffsetMatrix).a2 = fVar16;
                (paVar30->mOffsetMatrix).a3 = fVar17;
                (paVar30->mOffsetMatrix).a4 = fVar18;
                pBVar32 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                uVar31 = pBVar32[local_c8].mName._M_string_length;
                if (uVar31 < 0x400) {
                  paVar30 = ppaVar29[uVar36];
                  (paVar30->mName).length = (ai_uint32)uVar31;
                  memcpy((paVar30->mName).data,pBVar32[local_c8].mName._M_dataplus._M_p,uVar31);
                  (paVar30->mName).data[uVar31] = '\0';
                  pBVar32 = (this->asBones).
                            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                pBVar32[local_c8].bIsUsed = true;
                paVar30 = ppaVar29[uVar36];
                if (paVar30->mNumWeights != 0) {
                  uVar31 = 0;
                  do {
                    paVar30->mWeights[uVar31].mVertexId = *(uint *)(*puVar24 + uVar31 * 8);
                    ppaVar29[uVar36]->mWeights[uVar31].mWeight =
                         *(float *)(*puVar24 + 4 + uVar31 * 8);
                    uVar31 = uVar31 + 1;
                    paVar30 = ppaVar29[uVar36];
                  } while (uVar31 < paVar30->mNumWeights);
                }
                uVar36 = local_cc + 1;
                pBVar32 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pBVar35 = (this->asBones).
                          super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                uVar45 = local_a8;
                ppaVar21 = local_90;
                puVar24 = local_b8;
                uVar31 = local_c0;
                local_cc = uVar36;
              }
              uVar45 = (ulong)((int)uVar45 + 1);
              uVar23 = ((long)pBVar35 - (long)pBVar32 >> 4) * -0x71c71c71c71c71c7;
            } while (uVar45 <= uVar23 && uVar23 - uVar45 != 0);
          }
        }
      }
      puVar24 = local_60;
      uVar31 = *local_60 * 0x18;
      uVar45 = uVar31;
      uVar23 = *local_60;
      while (uVar23 != 0) {
        pvVar5 = *(void **)((long)puVar24 + (uVar45 - 0x10));
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,*(long *)((long)puVar24 + uVar45) - (long)pvVar5);
        }
        uVar45 = uVar45 - 0x18;
        uVar23 = uVar45;
      }
      operator_delete__(puVar24,uVar31 + 8);
      uVar36 = local_ac + 1;
      paVar41 = this->pScene;
    } while (uVar36 < paVar41->mNumMeshes);
  }
  puVar24 = local_68;
  uVar31 = *local_68 * 0x18;
  uVar45 = uVar31;
  uVar23 = *local_68;
  while (uVar23 != 0) {
    pvVar5 = *(void **)((long)puVar24 + (uVar45 - 0x10));
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,*(long *)((long)puVar24 + uVar45) - (long)pvVar5);
    }
    uVar45 = uVar45 - 0x18;
    uVar23 = uVar45;
  }
  operator_delete__(puVar24,uVar31 + 8);
  return;
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}